

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableParameter.cpp
# Opt level: O2

bool __thiscall DIS::VariableParameter::operator==(VariableParameter *this,VariableParameter *rhs)

{
  return (((this->_variableParameterFields4 == rhs->_variableParameterFields4 &&
           this->_variableParameterFields3 == rhs->_variableParameterFields3) &&
          this->_variableParameterFields2 == rhs->_variableParameterFields2) &&
         this->_recordType == rhs->_recordType) &&
         this->_variableParameterFields1 == rhs->_variableParameterFields1;
}

Assistant:

bool VariableParameter::operator ==(const VariableParameter& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_recordType == rhs._recordType) ) ivarsEqual = false;
     if( ! (_variableParameterFields1 == rhs._variableParameterFields1) ) ivarsEqual = false;
     if( ! (_variableParameterFields2 == rhs._variableParameterFields2) ) ivarsEqual = false;
     if( ! (_variableParameterFields3 == rhs._variableParameterFields3) ) ivarsEqual = false;
     if( ! (_variableParameterFields4 == rhs._variableParameterFields4) ) ivarsEqual = false;

    return ivarsEqual;
 }